

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O0

int sort_cmp(void *a,void *b)

{
  char *pcVar1;
  char *pcVar2;
  int in_dir2;
  int in_dir1;
  file_sorted_t *sort2;
  file_sorted_t *sort1;
  void *b_local;
  void *a_local;
  
  pcVar1 = strchr(*(char **)((long)a + 8),0x2f);
  pcVar2 = strchr(*(char **)((long)b + 8),0x2f);
  if ((pcVar1 == (char *)0x0) || (pcVar2 != (char *)0x0)) {
    if ((pcVar1 != (char *)0x0) || (pcVar2 == (char *)0x0)) {
      a_local._4_4_ = strcmp(*(char **)((long)a + 8),*(char **)((long)b + 8));
    }
    else {
      a_local._4_4_ = 1;
    }
  }
  else {
    a_local._4_4_ = -1;
  }
  return a_local._4_4_;
}

Assistant:

int sort_cmp(const void *a, const void *b)
{
	const file_sorted_t *sort1 = (const file_sorted_t *)a;
	const file_sorted_t *sort2 = (const file_sorted_t *)b;
	int in_dir1, in_dir2;

	in_dir1 = (strchr(sort1->path_in_zip, '/') != NULL);
	in_dir2 = (strchr(sort2->path_in_zip, '/') != NULL);
	if (in_dir1 == 1 && in_dir2 == 0)
	{
		return -1;
	}
	if (in_dir1 == 0 && in_dir2 == 1)
	{
		return 1;
	}
	return strcmp(((const file_sorted_t *)a)->path_in_zip,
		((const file_sorted_t *)b)->path_in_zip);
}